

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

SequenceRepeatLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::SequenceRepeatLayerParams>
          (Arena *arena)

{
  SequenceRepeatLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (SequenceRepeatLayerParams *)operator_new(0x20);
    CoreML::Specification::SequenceRepeatLayerParams::SequenceRepeatLayerParams
              (this,(Arena *)0x0,false);
  }
  else {
    this = (SequenceRepeatLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x20,
                      (type_info *)&CoreML::Specification::SequenceRepeatLayerParams::typeinfo);
    CoreML::Specification::SequenceRepeatLayerParams::SequenceRepeatLayerParams(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }